

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexString_Test::TestBody(LexerTest_LexString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1368;
  AssertHelper local_1348;
  Message local_1340 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1330;
  string_view local_1308;
  Lexer local_12f8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12a0;
  bool local_1271;
  undefined1 local_1270 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1240;
  Message local_1238 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1228;
  string_view local_1200;
  Lexer local_11f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1198;
  bool local_1169;
  undefined1 local_1168 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_1138;
  Message local_1130 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1120;
  string_view local_10f8;
  Lexer local_10e8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1090;
  bool local_1061;
  undefined1 local_1060 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_1030;
  Message local_1028 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1018;
  string_view local_ff0;
  Lexer local_fe0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f88;
  bool local_f59;
  undefined1 local_f58 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_f28;
  Message local_f20 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f10;
  string_view local_ee8;
  Lexer local_ed8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e80;
  bool local_e51;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_e20;
  Message local_e18 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e08;
  string_view local_de0;
  Lexer local_dd0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d78;
  bool local_d49;
  undefined1 local_d48 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_d18;
  Message local_d10 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d00;
  string_view local_cd8;
  Lexer local_cc8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c70;
  bool local_c41;
  undefined1 local_c40 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_c10;
  Message local_c08 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf8;
  string_view local_bd0;
  Lexer local_bc0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b68;
  bool local_b39;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_b08;
  Message local_b00 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_af0;
  string_view local_ac8;
  Lexer local_ab8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a60;
  bool local_a31;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_a00;
  Message local_9f8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9e8;
  string_view local_9c0;
  Lexer local_9b0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_958;
  bool local_929;
  undefined1 local_928 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_8f8;
  Message local_8f0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e0;
  string_view local_8b8;
  Lexer local_8a8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_7f0;
  Message local_7e8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7d8;
  string_view local_7b0;
  Lexer local_7a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_748;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_6e8;
  Message local_6e0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d0;
  string_view local_6a8;
  Lexer local_698;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_640;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar_;
  Message local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  string_view local_5a0;
  Lexer local_590;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_5;
  Message local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  string_view local_4a0;
  Lexer local_490;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_4;
  Message local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  string_view local_360;
  Lexer local_350;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_3;
  Message local_2b8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  string_view local_280;
  Lexer local_270;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  string_view local_1a0;
  Lexer local_190;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  Message local_f8 [4];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  string_view local_b0;
  Lexer local_a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LexerTest_LexString_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_b0 = sv("\"The quick brown fox jumps over the lazy dog\"",0x2d);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_a0,local_b0,&local_d8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char[44],_nullptr>
            ((EqHelper *)local_20,
             "Lexer(\"\\\"The quick brown fox jumps over the lazy dog\\\"\"sv).takeString()",
             "\"The quick brown fox jumps over the lazy dog\"",&local_48,
             (char (*) [44])"The quick brown fox jumps over the lazy dog");
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_48);
  ::wasm::WATParser::Lexer::~Lexer(&local_a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x386,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_1a0 = sv("\"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'\"",0x25);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_190,local_1a0,&local_1c8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char[36],_nullptr>
            ((EqHelper *)local_110,
             "Lexer(\"\\\"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'\\\"\"sv).takeString()",
             "\"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'\"",&local_138,
             (char (*) [36])"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'");
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_138);
  ::wasm::WATParser::Lexer::~Lexer(&local_190);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x388,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_280 = sv("\"_\\t_\\n_\\r_\\\\_\\\"_\\\'_\"",0x15);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_270,local_280,&local_2a8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char[14],_nullptr>
            ((EqHelper *)local_1f0,
             "Lexer(\"\\\"_\\\\t_\\\\n_\\\\r_\\\\\\\\_\\\\\\\"_\\\\\'_\\\"\"sv).takeString()",
             "\"_\\t_\\n_\\r_\\\\_\\\"_\\\'_\"",&local_218,(char (*) [14])"_\t_\n_\r_\\_\"_\'_");
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_218);
  ::wasm::WATParser::Lexer::~Lexer(&local_270);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x38a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_360 = sv("\"_\\00_\\07_\\20_\\5A_\\7F_\\ff_\\ffff_\"",0x21);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_350,local_360,&local_388);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  s_abi_cxx11_(&local_3d0,"_",0xe);
  s_abi_cxx11_(&local_3f0,"ff_",3);
  std::operator+(&local_3b0,&local_3d0,&local_3f0);
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2d0,
             "Lexer(\"\\\"_\\\\00_\\\\07_\\\\20_\\\\5A_\\\\7F_\\\\ff_\\\\ffff_\\\"\"sv).takeString()"
             ,"\"_\\0_\\7_ _Z_\\x7f_\\xff_\\xff\"s + \"ff_\"s",&local_2f8,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2f8);
  ::wasm::WATParser::Lexer::~Lexer(&local_350);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x38c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_4a0 = sv("\"_\\u{24}_\\u{00a3}_\\u{20AC}_\\u{10348}_\"",0x26);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_490,local_4a0,&local_4c8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  s_abi_cxx11_(&local_4f0,anon_var_dwarf_3922fe,0xf);
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_410,
             "Lexer(\"\\\"_\\\\u{24}_\\\\u{00a3}_\\\\u{20AC}_\\\\u{10348}_\\\"\"sv).takeString()",
             "\"_$_\\xC2\\xA3_\\xE2\\x82\\xAC_\\xF0\\x90\\x8D\\x88_\"s",&local_438,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_438);
  ::wasm::WATParser::Lexer::~Lexer(&local_490);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x390,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_5a0 = sv(anon_var_dwarf_392524,0x11);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_590,local_5a0,&local_5c8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  s_abi_cxx11_(&local_5f0,anon_var_dwarf_3922fe,0xf);
  testing::internal::EqHelper::
  Compare<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_510,
             "Lexer(\"\\\"_$_\\xC2\\xA3_\\xE2\\x82\\xAC_\\xF0\\x90\\x8D\\x88_\\\"\"sv).takeString()"
             ,"\"_$_\\xC2\\xA3_\\xE2\\x82\\xAC_\\xF0\\x90\\x8D\\x88_\"s",&local_538,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_538);
  ::wasm::WATParser::Lexer::~Lexer(&local_590);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_5c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x393,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  local_6a8 = sv("\"unterminated",0xd);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_698,local_6a8,&local_6d0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_611 = std::optional::operator_cast_to_bool((optional *)&local_640);
  local_611 = !local_611;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_610,&local_611,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_640);
  ::wasm::WATParser::Lexer::~Lexer(&local_698);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_6d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar1) {
    testing::Message::Message(local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_610,
               (AssertionResult *)"Lexer(\"\\\"unterminated\"sv).takeString()","true","false",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x395,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6e8,local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  local_7b0 = sv("\"unescaped nul",0x10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_7a0,local_7b0,&local_7d8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_719 = std::optional::operator_cast_to_bool((optional *)&local_748);
  local_719 = !local_719;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_748);
  ::wasm::WATParser::Lexer::~Lexer(&local_7a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_7d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(local_7e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_718,
               (AssertionResult *)"Lexer(\"\\\"unescaped nul\\0\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x396,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7f0,local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_8b8 = sv("\"unescaped U+19\x19\"",0x11);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_8a8,local_8b8,&local_8e0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_821 = std::optional::operator_cast_to_bool((optional *)&local_850);
  local_821 = !local_821;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_820,&local_821,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_850);
  ::wasm::WATParser::Lexer::~Lexer(&local_8a8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(local_8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_820,
               (AssertionResult *)"Lexer(\"\\\"unescaped U+19\\x19\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x397,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f8,local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  local_9c0 = sv("\"unescaped U+7f\x7f\"",0x11);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_9b0,local_9c0,&local_9e8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_929 = std::optional::operator_cast_to_bool((optional *)&local_958);
  local_929 = !local_929;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_928,&local_929,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_958);
  ::wasm::WATParser::Lexer::~Lexer(&local_9b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_9e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(local_9f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_928,
               (AssertionResult *)"Lexer(\"\\\"unescaped U+7f\\x7f\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x398,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a00,local_9f8);
    testing::internal::AssertHelper::~AssertHelper(&local_a00);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  local_ac8 = sv("\"\\ stray backslash\"",0x13);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ab8,local_ac8,&local_af0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_a31 = std::optional::operator_cast_to_bool((optional *)&local_a60);
  local_a31 = !local_a31;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a30,&local_a31,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a60);
  ::wasm::WATParser::Lexer::~Lexer(&local_ab8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
  if (!bVar1) {
    testing::Message::Message(local_b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_a30,
               (AssertionResult *)"Lexer(\"\\\"\\\\ stray backslash\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x399,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b08,local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
  local_bd0 = sv("\"short \\f hex escape\"",0x15);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_bc0,local_bd0,&local_bf8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_b39 = std::optional::operator_cast_to_bool((optional *)&local_b68);
  local_b39 = !local_b39;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b38,&local_b39,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b68);
  ::wasm::WATParser::Lexer::~Lexer(&local_bc0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_bf8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar1) {
    testing::Message::Message(local_c08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_b38,
               (AssertionResult *)"Lexer(\"\\\"short \\\\f hex escape\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c10,local_c08);
    testing::internal::AssertHelper::~AssertHelper(&local_c10);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  local_cd8 = sv("\"bad hex \\gg\"",0xd);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_cc8,local_cd8,&local_d00);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_c41 = std::optional::operator_cast_to_bool((optional *)&local_c70);
  local_c41 = !local_c41;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c40,&local_c41,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_c70);
  ::wasm::WATParser::Lexer::~Lexer(&local_cc8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_d00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c40);
  if (!bVar1) {
    testing::Message::Message(local_d10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_c40,
               (AssertionResult *)"Lexer(\"\\\"bad hex \\\\gg\\\"\"sv).takeString()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d18,local_d10);
    testing::internal::AssertHelper::~AssertHelper(&local_d18);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_d10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c40);
  local_de0 = sv("\"empty unicode \\u{}\"",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_dd0,local_de0,&local_e08);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_d49 = std::optional::operator_cast_to_bool((optional *)&local_d78);
  local_d49 = !local_d49;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d48,&local_d49,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_d78);
  ::wasm::WATParser::Lexer::~Lexer(&local_dd0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d48);
  if (!bVar1) {
    testing::Message::Message(local_e18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_d48,
               (AssertionResult *)"Lexer(\"\\\"empty unicode \\\\u{}\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e20,local_e18);
    testing::internal::AssertHelper::~AssertHelper(&local_e20);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d48);
  local_ee8 = sv("\"not unicode \\u{abcdefg}\"",0x19);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ed8,local_ee8,&local_f10);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_e51 = std::optional::operator_cast_to_bool((optional *)&local_e80);
  local_e51 = !local_e51;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e50,&local_e51,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e80);
  ::wasm::WATParser::Lexer::~Lexer(&local_ed8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_f10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(local_f20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_e50,
               (AssertionResult *)"Lexer(\"\\\"not unicode \\\\u{abcdefg}\\\"\"sv).takeString()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f28,local_f20);
    testing::internal::AssertHelper::~AssertHelper(&local_f28);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  local_ff0 = sv("\"extra chars \\u{123(}\"",0x16);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_fe0,local_ff0,&local_1018);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_f59 = std::optional::operator_cast_to_bool((optional *)&local_f88);
  local_f59 = !local_f59;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f58,&local_f59,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_f88);
  ::wasm::WATParser::Lexer::~Lexer(&local_fe0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1018);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f58);
  if (!bVar1) {
    testing::Message::Message(local_1028);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_f58,
               (AssertionResult *)"Lexer(\"\\\"extra chars \\\\u{123(}\\\"\"sv).takeString()","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1030,local_1028);
    testing::internal::AssertHelper::~AssertHelper(&local_1030);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_1028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f58);
  local_10f8 = sv("\"unpaired surrogate unicode crimes \\u{d800}\"",0x2c);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_10e8,local_10f8,&local_1120);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_1061 = std::optional::operator_cast_to_bool((optional *)&local_1090);
  local_1061 = !local_1061;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1060,&local_1061,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1090);
  ::wasm::WATParser::Lexer::~Lexer(&local_10e8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1060);
  if (!bVar1) {
    testing::Message::Message(local_1130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_1060,
               (AssertionResult *)
               "Lexer(\"\\\"unpaired surrogate unicode crimes \\\\u{d800}\\\"\"sv).takeString()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1138,local_1130);
    testing::internal::AssertHelper::~AssertHelper(&local_1138);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_1130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1060);
  local_1200 = sv("\"more surrogate unicode crimes \\u{dfff}\"",0x28);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_11f0,local_1200,&local_1228);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_1169 = std::optional::operator_cast_to_bool((optional *)&local_1198);
  local_1169 = !local_1169;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1168,&local_1169,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1198);
  ::wasm::WATParser::Lexer::~Lexer(&local_11f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1168);
  if (!bVar1) {
    testing::Message::Message(local_1238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1168,
               (AssertionResult *)
               "Lexer(\"\\\"more surrogate unicode crimes \\\\u{dfff}\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1240,local_1238);
    testing::internal::AssertHelper::~AssertHelper(&local_1240);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_1238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
  local_1308 = sv("\"too big \\u{110000}\"",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_12f8,local_1308,&local_1330);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_1271 = std::optional::operator_cast_to_bool((optional *)&local_12a0);
  local_1271 = !local_1271;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1270,&local_1271,(type *)0x0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_12a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_12f8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1270);
  if (!bVar1) {
    testing::Message::Message(local_1340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1368,(internal *)local_1270,
               (AssertionResult *)"Lexer(\"\\\"too big \\\\u{110000}\\\"\"sv).takeString()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1348,local_1340);
    testing::internal::AssertHelper::~AssertHelper(&local_1348);
    std::__cxx11::string::~string((string *)&local_1368);
    testing::Message::~Message(local_1340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1270);
  return;
}

Assistant:

TEST(LexerTest, LexString) {
  using namespace std::string_literals;
  EXPECT_EQ(
    Lexer("\"The quick brown fox jumps over the lazy dog\""sv).takeString(),
    "The quick brown fox jumps over the lazy dog");
  EXPECT_EQ(Lexer("\"`~!@#$%^&*()_-+0123456789|,.<>/?;:'\""sv).takeString(),
            "`~!@#$%^&*()_-+0123456789|,.<>/?;:'");
  EXPECT_EQ(Lexer("\"_\\t_\\n_\\r_\\\\_\\\"_\\'_\""sv).takeString(),
            "_\t_\n_\r_\\_\"_\'_");
  EXPECT_EQ(Lexer("\"_\\00_\\07_\\20_\\5A_\\7F_\\ff_\\ffff_\""sv).takeString(),
            "_\0_\7_ _Z_\x7f_\xff_\xff"s + "ff_"s);
  // _$_£_€_𐍈_
  EXPECT_EQ(
    Lexer("\"_\\u{24}_\\u{00a3}_\\u{20AC}_\\u{10348}_\""sv).takeString(),
    "_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_"s);
  EXPECT_EQ(
    Lexer("\"_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_\""sv).takeString(),
    "_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_"s);

  EXPECT_FALSE(Lexer("\"unterminated"sv).takeString());
  EXPECT_FALSE(Lexer("\"unescaped nul\0\""sv).takeString());
  EXPECT_FALSE(Lexer("\"unescaped U+19\x19\""sv).takeString());
  EXPECT_FALSE(Lexer("\"unescaped U+7f\x7f\""sv).takeString());
  EXPECT_FALSE(Lexer("\"\\ stray backslash\""sv).takeString());
  EXPECT_FALSE(Lexer("\"short \\f hex escape\""sv).takeString());
  EXPECT_FALSE(Lexer("\"bad hex \\gg\""sv).takeString());
  EXPECT_FALSE(Lexer("\"empty unicode \\u{}\""sv).takeString());
  EXPECT_FALSE(Lexer("\"not unicode \\u{abcdefg}\""sv).takeString());
  EXPECT_FALSE(Lexer("\"extra chars \\u{123(}\""sv).takeString());
  EXPECT_FALSE(
    Lexer("\"unpaired surrogate unicode crimes \\u{d800}\""sv).takeString());
  EXPECT_FALSE(
    Lexer("\"more surrogate unicode crimes \\u{dfff}\""sv).takeString());
  EXPECT_FALSE(Lexer("\"too big \\u{110000}\""sv).takeString());
}